

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  Ch *pCVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar12;
  byte *pbVar13;
  uint uVar14;
  byte *pbVar15;
  uint16_t uVar16;
  Ch c;
  int iVar17;
  int iVar18;
  ushort uVar19;
  ulong uVar20;
  Ch c_7;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Number NVar25;
  double local_78;
  
  pbVar13 = (byte *)is->current_;
  pbVar15 = pbVar13 + (is->count_ - (long)is->buffer_);
  bVar1 = *pbVar13;
  bVar8 = bVar1;
  if (bVar1 == 0x2d) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    pbVar13 = (byte *)is->current_;
    bVar8 = *pbVar13;
  }
  if (bVar8 == 0x30) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    uVar14 = (uint)(byte)*is->current_;
    local_78 = 0.0;
    bVar7 = false;
    uVar20 = 0;
    iVar18 = 0;
    bVar6 = false;
    bVar5 = false;
    uVar21 = 0;
  }
  else {
    if (8 < (byte)(bVar8 - 0x31)) {
      if (*(int *)(this + 0x30) == 0) {
        sVar3 = is->count_;
        pCVar4 = is->buffer_;
        *(undefined4 *)(this + 0x30) = 3;
        *(byte **)(this + 0x38) = pbVar13 + (sVar3 - (long)pCVar4);
        return;
      }
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/reader.h"
                    ,0x5fc,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::BasicIStreamWrapper<std::basic_istream<char>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    uVar21 = bVar8 - 0x30;
    bVar8 = *is->current_;
    uVar10 = (ulong)bVar8;
    uVar14 = (uint)bVar8;
    local_78 = 0.0;
    if (bVar1 == 0x2d) {
      if ((byte)(bVar8 - 0x30) < 10) {
        iVar18 = 0;
LAB_00103514:
        if (uVar21 < 0xccccccc) {
LAB_0010351d:
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
          uVar21 = (uVar21 * 10 + (int)uVar10) - 0x30;
          iVar18 = iVar18 + 1;
          bVar8 = *is->current_;
          uVar10 = (ulong)bVar8;
          if (9 < (byte)(bVar8 - 0x30)) goto LAB_00103608;
          goto LAB_00103514;
        }
        if (uVar21 != 0xccccccc) goto LAB_0010359f;
        if ((byte)uVar10 < 0x39) goto LAB_0010351d;
        uVar21 = 0xccccccc;
        uVar10 = 0x39;
LAB_0010359f:
        uVar20 = (ulong)uVar21;
        if (bVar1 == 0x2d) {
          do {
            if ((0xccccccccccccccb < uVar20) && (0x38 < (byte)uVar10 || uVar20 != 0xccccccccccccccc)
               ) goto LAB_0010367c;
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
            uVar20 = (uVar10 & 0xf) + uVar20 * 10;
            iVar18 = iVar18 + 1;
            bVar8 = *is->current_;
            uVar10 = (ulong)bVar8;
          } while ((byte)(bVar8 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < uVar20) &&
               (0x35 < (byte)uVar10 || uVar20 != 0x1999999999999999)) goto LAB_0010367c;
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
            uVar20 = (uVar10 & 0xf) + uVar20 * 10;
            iVar18 = iVar18 + 1;
            bVar8 = *is->current_;
            uVar10 = (ulong)bVar8;
          } while ((byte)(bVar8 - 0x30) < 10);
        }
        uVar14 = (uint)bVar8;
        local_78 = 0.0;
        bVar5 = true;
        bVar7 = false;
        bVar6 = false;
      }
      else {
LAB_00103c5b:
        bVar7 = false;
        uVar20 = 0;
        iVar18 = 0;
        bVar6 = false;
        bVar5 = false;
      }
    }
    else {
      if (9 < (byte)(bVar8 - 0x30)) goto LAB_00103c5b;
      iVar18 = 0;
      do {
        if (0x19999998 < uVar21) {
          if (uVar21 != 0x19999999) goto LAB_0010359f;
          if (0x35 < (byte)uVar10) {
            uVar21 = 0x19999999;
            goto LAB_0010359f;
          }
        }
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        uVar21 = (uVar21 * 10 + (int)uVar10) - 0x30;
        iVar18 = iVar18 + 1;
        bVar8 = *is->current_;
        uVar10 = (ulong)bVar8;
      } while ((byte)(bVar8 - 0x30) < 10);
LAB_00103608:
      uVar14 = (uint)bVar8;
      bVar7 = false;
      uVar20 = 0;
      bVar6 = false;
      bVar5 = false;
      local_78 = 0.0;
    }
  }
  goto LAB_001036f4;
LAB_0010367c:
  auVar22._8_4_ = (int)(uVar20 >> 0x20);
  auVar22._0_8_ = uVar20;
  auVar22._12_4_ = 0x45300000;
  local_78 = (auVar22._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0);
  do {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    local_78 = local_78 * 10.0 + (double)((int)uVar10 + -0x30);
    bVar8 = *is->current_;
    uVar10 = (ulong)bVar8;
    uVar14 = (uint)bVar8;
  } while ((byte)(bVar8 - 0x30) < 10);
  bVar7 = true;
  bVar6 = true;
  bVar5 = true;
LAB_001036f4:
  uVar10 = (ulong)uVar21;
  if ((char)uVar14 == '.') {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    bVar8 = *is->current_;
    uVar14 = (uint)bVar8;
    if ((byte)(bVar8 - 0x3a) < 0xf6) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/reader.h"
                      ,0x627,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::BasicIStreamWrapper<std::basic_istream<char>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pbVar13 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
      *(undefined4 *)(this + 0x30) = 0xe;
      goto LAB_00103c06;
    }
    iVar9 = 0;
    if (!bVar7) {
      if (!bVar5) {
        uVar20 = uVar10;
      }
      iVar9 = 0;
      do {
        if ((0x39 < (byte)uVar14) || (uVar20 >> 0x35 != 0)) break;
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        iVar9 = iVar9 + -1;
        uVar20 = (ulong)(uVar14 - 0x30) + uVar20 * 10;
        iVar18 = iVar18 + (uint)(uVar20 != 0);
        uVar14 = (uint)(byte)*is->current_;
      } while ('/' < *is->current_);
      auVar23._8_4_ = (int)(uVar20 >> 0x20);
      auVar23._0_8_ = uVar20;
      auVar23._12_4_ = 0x45300000;
      local_78 = (auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0);
      bVar6 = true;
    }
    bVar8 = (byte)uVar14;
    while ((byte)(bVar8 - 0x30) < 10) {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      if (iVar18 < 0x11) {
        local_78 = local_78 * 10.0 + (double)(int)(uVar14 - 0x30);
        iVar9 = iVar9 + -1;
        if (0.0 < local_78) {
          iVar18 = iVar18 + 1;
        }
      }
      bVar8 = *is->current_;
      uVar14 = (uint)bVar8;
    }
  }
  else {
    iVar9 = 0;
  }
  if ((uVar14 | 0x20) == 0x65) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    uVar11 = uVar10;
    if (bVar5) {
      uVar11 = uVar20;
    }
    if (!bVar6) {
      auVar24._8_4_ = (int)(uVar11 >> 0x20);
      auVar24._0_8_ = uVar11;
      auVar24._12_4_ = 0x45300000;
      local_78 = (auVar24._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
      bVar6 = true;
    }
    bVar7 = false;
    if (*is->current_ == '+') {
LAB_001038a5:
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    }
    else if (*is->current_ == '-') {
      bVar7 = true;
      goto LAB_001038a5;
    }
    bVar8 = *is->current_;
    if (9 < (byte)(bVar8 - 0x30)) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/reader.h"
                      ,0x67c,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::BasicIStreamWrapper<std::basic_istream<char>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pbVar13 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
      *(undefined4 *)(this + 0x30) = 0xf;
LAB_00103c06:
      *(byte **)(this + 0x38) = pbVar13;
      return;
    }
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    iVar17 = bVar8 - 0x30;
    if (!bVar7) {
      do {
        bVar8 = *is->current_;
        if (9 < (byte)(bVar8 - 0x30)) goto LAB_0010397a;
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        iVar17 = iVar17 * 10 + (uint)bVar8 + -0x30;
      } while (iVar17 <= 0x134 - iVar9);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/reader.h"
                      ,0x677,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::BasicIStreamWrapper<std::basic_istream<char>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      goto LAB_00103a1a;
    }
    if (0 < iVar9) {
      __assert_fail("expFrac <= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/reader.h"
                    ,0x667,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::BasicIStreamWrapper<std::basic_istream<char>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    bVar2 = *is->current_;
    bVar8 = bVar2 - 0x30;
    do {
      if (9 < bVar8) goto LAB_0010397a;
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      iVar17 = iVar17 * 10 + (uint)bVar2 + -0x30;
      bVar2 = *is->current_;
      bVar8 = bVar2 - 0x30;
    } while (iVar17 <= (iVar9 + 0x7ffffff7) / 10);
    while (bVar8 < 10) {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      bVar8 = *is->current_ - 0x30;
    }
LAB_0010397a:
    iVar18 = -iVar17;
    if (!bVar7) {
      iVar18 = iVar17;
    }
  }
  else {
    iVar18 = 0;
  }
  if (!bVar6) {
    if (!bVar5) {
      if (bVar1 == 0x2d) {
        pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar12->data_).s.str = (Ch *)0x0;
        *(long *)&pGVar12->data_ = (long)(int)-uVar21;
        uVar16 = 0xb6;
        if ((int)uVar21 < 1) {
          uVar16 = 0x1f6;
        }
        (pGVar12->data_).f.flags = uVar16;
        return;
      }
      pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar12->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar12->data_ = uVar10;
      (pGVar12->data_).f.flags = (ushort)(-1 < (int)uVar21) << 5 | 0x1d6;
      return;
    }
    if (bVar1 != 0x2d) {
      pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar12->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar12->data_ = uVar20;
      uVar19 = (ushort)((uVar20 & 0xffffffff80000000) == 0) << 5 | 0x1d6;
      if (uVar20 >> 0x20 != 0) {
        uVar19 = (ushort)(-1 < (long)uVar20) << 7 | 0x116;
      }
      (pGVar12->data_).f.flags = uVar19;
      return;
    }
    bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Int64(handler,-uVar20);
    if (bVar7) {
      return;
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/reader.h"
                    ,0x6c3,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::BasicIStreamWrapper<std::basic_istream<char>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_00103a1a:
    *(byte **)(this + 0x38) = pbVar15;
    return;
  }
  uVar14 = iVar18 + iVar9;
  if ((int)uVar14 < -0x134) {
    NVar25.i64 = 0;
    if (uVar14 < 0xfffffd98) goto LAB_00103b58;
    NVar25.d = (local_78 / 1e+308) /
               *(double *)(internal::Pow10(int)::e + (ulong)(-uVar14 - 0x134) * 8);
  }
  else if ((int)uVar14 < 0) {
    NVar25.d = local_78 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar14 * 8);
  }
  else {
    if (0x134 < uVar14) {
      __assert_fail("n >= 0 && n <= 308",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/internal/pow10.h"
                    ,0x30,"double rapidjson::internal::Pow10(int)");
    }
    NVar25.d = local_78 * *(double *)(internal::Pow10(int)::e + (ulong)uVar14 * 8);
  }
  if (1.79769313486232e+308 < NVar25.d) {
    if (*(int *)(this + 0x30) == 0) {
      *(undefined4 *)(this + 0x30) = 0xd;
      *(byte **)(this + 0x38) = pbVar15;
      return;
    }
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/reader.h"
                  ,0x6ab,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::BasicIStreamWrapper<std::basic_istream<char>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
LAB_00103b58:
  if (bVar1 == 0x2d) {
    NVar25.u64 = NVar25.u64 ^ 0x8000000000000000;
  }
  pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
            Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      (&handler->stack_,1);
  (pGVar12->data_).s.str = (Ch *)0x216000000000000;
  (pGVar12->data_).n = NVar25;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }